

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O3

void EdgeDetectionHelper::find
               (EdgeDetectionBase<double> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  EVP_PKEY_CTX *pEVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  uchar *__n;
  uint uVar4;
  gradientType gVar5;
  ulong uVar6;
  uint uVar7;
  uchar *sig;
  uint *puVar8;
  EVP_PKEY_CTX *pEVar9;
  uint uVar10;
  ulong uVar11;
  uchar *tbs;
  undefined4 in_register_0000008c;
  size_t tbslen;
  EVP_PKEY_CTX *pEVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  vector<double,_std::allocator<double>_> edgePositive;
  vector<double,_std::allocator<double>_> edgeNegative;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  vector<double,_std::allocator<double>_> local_c8;
  double local_b0;
  uchar *local_a8;
  EdgeDetectionBase<double> *local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  auVar15 = in_ZMM1._0_16_;
  auVar14 = in_ZMM0._0_16_;
  tbslen = CONCAT44(in_register_0000008c,height);
  __n = (uchar *)(ulong)height;
  uVar13 = (ulong)width;
  pEVar12 = (EVP_PKEY_CTX *)(ulong)x;
  local_a0 = edgeDetection;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar6 = uVar13;
  pEVar9 = pEVar12;
  tbs = __n;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  EdgeParameter::verify(edgeParameter,pEVar9,sig,uVar6,tbs,tbslen);
  if (edgeParameter->direction < TOP_TO_BOTTOM) {
    height = width;
  }
  if (3 < height) {
    uVar2 = image->_rowSize;
    local_80 = &local_a0->negativeEdgePoint;
    local_a8 = __n;
    if (edgeParameter->direction < TOP_TO_BOTTOM) {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar13,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,uVar13,(value_type_conflict3 *)&local_78,(allocator_type *)&local_c8);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,uVar13,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_98);
      uVar4 = edgeParameter->groupFactor;
      uVar7 = (int)local_a8 + 1;
      local_a8 = (uchar *)(ulong)uVar7;
      if (uVar7 != uVar4) {
        uVar7 = 0;
        auVar14 = vcvtusi2sd_avx512f(auVar14,(x - 1) + width);
        pEVar12 = pEVar12 + (long)(image->_data + uVar2 * y);
        local_b0 = auVar14._0_8_;
        auVar14 = vcvtusi2sd_avx512f(auVar15,x);
        do {
          if (width != 0) {
            uVar6 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar6] = (uint)(byte)pEVar12[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar13 != uVar6);
            uVar4 = edgeParameter->groupFactor;
          }
          if (1 < uVar4) {
            uVar6 = 1;
            uVar10 = uVar2;
            do {
              if (width != 0) {
                uVar11 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar11] =
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11] +
                       (uint)(byte)pEVar12[uVar11 + uVar10];
                  uVar11 = uVar11 + 1;
                } while (uVar13 != uVar11);
                uVar4 = edgeParameter->groupFactor;
              }
              uVar6 = uVar6 + 1;
              uVar10 = uVar10 + uVar2;
            } while (uVar6 < uVar4);
          }
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8d25b::findEdgePoints<double>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == LEFT_TO_RIGHT);
          gVar5 = edgeParameter->gradient;
          if (edgeParameter->direction == LEFT_TO_RIGHT) {
            if ((gVar5 | 2) == ANY) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,y + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveXEdge<double>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar14._0_8_,
                         (double)(auVar3._0_4_ * 0.5 + auVar15._0_4_));
              gVar5 = edgeParameter->gradient;
            }
            if (gVar5 - NEGATIVE < 2) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,y + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeXEdge<double>
                        (&local_98,local_80,local_b0,(double)(auVar3._0_4_ * 0.5 + auVar15._0_4_));
            }
          }
          else {
            if ((gVar5 | 2) == ANY) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,y + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeXEdge<double>
                        (&local_98,&local_a0->positiveEdgePoint,local_b0,
                         (double)(auVar3._0_4_ * 0.5 + auVar15._0_4_));
              gVar5 = edgeParameter->gradient;
            }
            if (gVar5 - NEGATIVE < 2) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,y + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveXEdge<double>
                        (&local_c8,local_80,auVar14._0_8_,
                         (double)(auVar3._0_4_ * 0.5 + auVar15._0_4_));
            }
          }
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = edgeParameter->groupFactor;
          uVar7 = uVar7 + edgeParameter->skipFactor;
          pEVar12 = pEVar12 + edgeParameter->skipFactor * uVar2;
        } while (uVar7 < (int)local_a8 - uVar4);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,(size_type)__n,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(size_type)__n,(value_type_conflict3 *)&local_78,
                 (allocator_type *)&local_c8);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(size_type)__n,(value_type_conflict3 *)&local_c8,
                 (allocator_type *)&local_98);
      uVar4 = edgeParameter->groupFactor;
      if (width + 1 != uVar4) {
        uVar13 = (ulong)(uVar2 * (int)local_a8);
        uVar7 = 0;
        auVar14 = vcvtusi2sd_avx512f(auVar14,(y - 1) + (int)local_a8);
        pEVar12 = pEVar12 + (long)(image->_data + uVar2 * y);
        local_b0 = auVar14._0_8_;
        auVar14 = vcvtusi2sd_avx512f(auVar15,y);
        do {
          if (uVar13 != 0) {
            uVar6 = 0;
            puVar8 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
            do {
              pEVar9 = pEVar12 + uVar6;
              uVar6 = uVar6 + uVar2;
              *puVar8 = (uint)(byte)*pEVar9;
              puVar8 = puVar8 + 1;
            } while (uVar13 != uVar6);
            uVar4 = edgeParameter->groupFactor;
          }
          if (1 < uVar4) {
            uVar6 = 1;
            pEVar9 = pEVar12;
            do {
              pEVar9 = pEVar9 + 1;
              if (uVar13 != 0) {
                uVar11 = 0;
                puVar8 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                do {
                  pEVar1 = pEVar9 + uVar11;
                  uVar11 = uVar11 + uVar2;
                  *puVar8 = *puVar8 + (uint)(byte)*pEVar1;
                  puVar8 = puVar8 + 1;
                } while (uVar13 != uVar11);
                uVar4 = edgeParameter->groupFactor;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar4);
          }
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8d25b::findEdgePoints<double>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == TOP_TO_BOTTOM);
          gVar5 = edgeParameter->gradient;
          if (edgeParameter->direction == TOP_TO_BOTTOM) {
            if ((gVar5 | 2) == ANY) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,x + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveYEdge<double>
                        (&local_c8,&local_a0->positiveEdgePoint,
                         (double)(auVar3._0_4_ * 0.5 + auVar15._0_4_),auVar14._0_8_);
              gVar5 = edgeParameter->gradient;
            }
            if (gVar5 - NEGATIVE < 2) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,x + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeYEdge<double>
                        (&local_98,local_80,(double)(auVar3._0_4_ * 0.5 + auVar15._0_4_),local_b0);
            }
          }
          else {
            if ((gVar5 | 2) == ANY) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,x + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createNegativeYEdge<double>
                        (&local_98,&local_a0->positiveEdgePoint,
                         (double)(auVar3._0_4_ * 0.5 + auVar15._0_4_),local_b0);
              gVar5 = edgeParameter->gradient;
            }
            if (gVar5 - NEGATIVE < 2) {
              auVar15 = vcvtusi2ss_avx512f(in_XMM2,x + uVar7);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8d25b::createPositiveYEdge<double>
                        (&local_c8,local_80,(double)(auVar3._0_4_ * 0.5 + auVar15._0_4_),
                         auVar14._0_8_);
            }
          }
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = edgeParameter->groupFactor;
          uVar7 = uVar7 + edgeParameter->skipFactor;
          pEVar12 = pEVar12 + edgeParameter->skipFactor;
        } while (uVar7 < (width + 1) - uVar4);
      }
    }
    if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<double> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}